

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Packet.cpp
# Opt level: O2

Packet * __thiscall mognetwork::Packet::operator<<(Packet *this,char *data)

{
  size_t sVar1;
  int32_t size;
  uint local_1c;
  
  sVar1 = strlen(data);
  local_1c = (uint)sVar1;
  operator<<(this,(int *)&local_1c);
  push(this,data,local_1c);
  return this;
}

Assistant:

Packet& Packet::operator<<(const char* data)
  {
    int32_t size = strlen(data) * sizeof(char);
    *this << size;
    push(data, size);
    return (*this);
  }